

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_help.cpp
# Opt level: O2

int __thiscall ktx::OptionsHelp::init(OptionsHelp *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  allocator<char> local_124;
  allocator<char> local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  undefined1 local_120 [40];
  element_type *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  shared_ptr<const_cxxopts::Value> local_e8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_121);
  cxxopts::Options::add_options((OptionAdder *)local_120,(Options *)ctx,&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"command",&local_122);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"The command for which usage should be displayed.",&local_123);
  cxxopts::value<std::__cxx11::string>();
  local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_f8;
  local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_f0._M_pi;
  local_f8 = (element_type *)0x0;
  _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_124);
  cxxopts::OptionAdder::operator()((OptionAdder *)local_120,&local_78,&local_98,&local_e8,&local_b8)
  ;
  std::__cxx11::string::~string((string *)&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)(local_120 + 8));
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"command",(allocator<char> *)local_120);
  cxxopts::Options::parse_positional((Options *)ctx,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"<command>",(allocator<char> *)local_120);
  std::__cxx11::string::operator=((string *)(ctx + 0x60),local_38);
  iVar1 = std::__cxx11::string::~string(local_38);
  return iVar1;
}

Assistant:

void init(cxxopts::Options& opts) {
        opts.add_options()
                ("command", "The command for which usage should be displayed.", cxxopts::value<std::string>());
        opts.parse_positional("command");
        opts.positional_help("<command>");
    }